

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O2

Am_Wrapper * __thiscall Store_Data::Make_Unique(Store_Data *this)

{
  Store_Data *pSVar1;
  
  pSVar1 = this;
  if (*(int *)&this->field_0x8 != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    pSVar1 = (Store_Data *)operator_new(0x10);
    *(undefined4 *)&pSVar1->field_0x8 = 1;
    *(undefined ***)pSVar1 = &PTR_ID_00118c20;
    pSVar1->datum = this->datum;
  }
  return &pSVar1->super_Am_Wrapper;
}

Assistant:

Am_Define_No_Self_Formula(const char *, retstr)
{
  Store_Data *store =
      (Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  data_test = store->datum;
  return "hello";
}